

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall NetworkNS::Network::~Network(Network *this)

{
  Network *this_local;
  
  this->_vptr_Network = (_func_int **)&PTR__Network_00125d60;
  std::__cxx11::list<sNode,_std::allocator<sNode>_>::clear(&this->nodes);
  std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::clear(&this->strands);
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::~vector(&this->sorted_chains);
  std::vector<sBond_type,_std::allocator<sBond_type>_>::~vector(&this->bond_types);
  std::vector<sBead_type,_std::allocator<sBead_type>_>::~vector(&this->node_types);
  std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::~list(&this->pslip_springs);
  std::__cxx11::
  list<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ::~list(&this->subchains);
  std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::~list(&this->strands);
  std::__cxx11::list<sNode,_std::allocator<sNode>_>::~list(&this->nodes);
  return;
}

Assistant:

Network::~Network() {
      nodes.clear();
      strands.clear();
   }